

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  ImGuiContext *pIVar1;
  unsigned_short *puVar2;
  float fVar3;
  
  puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,line_start_idx + char_idx);
  pIVar1 = GImGui;
  if (*puVar2 == 10) {
    fVar3 = -1.0;
  }
  else {
    fVar3 = ImFont::GetCharAdvance(GImGui->Font,*puVar2);
    fVar3 = (pIVar1->FontSize / pIVar1->Font->FontSize) * fVar3;
  }
  return fVar3;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->TextW[line_start_idx + char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; ImGuiContext& g = *GImGui; return g.Font->GetCharAdvance(c) * (g.FontSize / g.Font->FontSize); }